

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldSat.c
# Opt level: O0

Aig_Man_t *
Saig_ManUnrollWithCex(Aig_Man_t *pAig,Abc_Cex_t *pCex,int nInputs,Vec_Int_t **pvMapPiF2A)

{
  Vec_Ptr_t *p;
  anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 aVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  Vec_Vec_t *p_00;
  Vec_Vec_t *p_01;
  Aig_Obj_t *pAVar6;
  Vec_Int_t *pVVar7;
  Aig_Man_t *p_02;
  char *pcVar8;
  void *pvVar9;
  Aig_Obj_t *pAVar10;
  Aig_Obj_t *p1;
  Vec_Ptr_t *local_a8;
  int local_60;
  int iBit;
  int f;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vObjs;
  Vec_Int_t *vRoots;
  Vec_Vec_t *vFrameObjs;
  Vec_Vec_t *vFrameCos;
  Aig_Man_t *pFrames;
  Vec_Int_t **pvMapPiF2A_local;
  int nInputs_local;
  Abc_Cex_t *pCex_local;
  Aig_Man_t *pAig_local;
  
  iVar2 = Saig_ManPiNum(pAig);
  if (iVar2 != pCex->nPis) {
    __assert_fail("Saig_ManPiNum(pAig) == pCex->nPis",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                  ,0x111,
                  "Aig_Man_t *Saig_ManUnrollWithCex(Aig_Man_t *, Abc_Cex_t *, int, Vec_Int_t **)");
  }
  iVar2 = Saig_ManRegNum(pAig);
  if (iVar2 != pCex->nRegs) {
    __assert_fail("Saig_ManRegNum(pAig) == pCex->nRegs",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                  ,0x112,
                  "Aig_Man_t *Saig_ManUnrollWithCex(Aig_Man_t *, Abc_Cex_t *, int, Vec_Int_t **)");
  }
  if ((pCex->iPo < 0) || (iVar2 = pCex->iPo, iVar3 = Saig_ManPoNum(pAig), iVar3 <= iVar2)) {
    __assert_fail("pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absOldSat.c"
                  ,0x113,
                  "Aig_Man_t *Saig_ManUnrollWithCex(Aig_Man_t *, Abc_Cex_t *, int, Vec_Int_t **)");
  }
  pVVar5 = Vec_IntAlloc(1000);
  *pvMapPiF2A = pVVar5;
  p_00 = Vec_VecStart(pCex->iFrame + 1);
  p_01 = Vec_VecStart(pCex->iFrame + 1);
  pAVar6 = Aig_ManCo(pAig,pCex->iPo);
  iVar2 = pCex->iFrame;
  iVar3 = Aig_ObjId(pAVar6);
  Vec_VecPushInt(p_00,iVar2,iVar3);
  for (local_60 = pCex->iFrame; -1 < local_60; local_60 = local_60 + -1) {
    Aig_ManIncrementTravId(pAig);
    pVVar5 = Vec_VecEntryInt(p_00,local_60);
    for (iBit = 0; iVar2 = Vec_IntSize(pVVar5), iBit < iVar2; iBit = iBit + 1) {
      iVar2 = Vec_IntEntry(pVVar5,iBit);
      pAVar6 = Aig_ManObj(pAig,iVar2);
      pVVar7 = Vec_VecEntryInt(p_01,local_60);
      if (local_60 == 0) {
        local_a8 = (Vec_Ptr_t *)0x0;
      }
      else {
        local_a8 = Vec_VecEntry(p_00,local_60 + -1);
      }
      Saig_ManUnrollCollect_rec(pAig,pAVar6,pVVar7,(Vec_Int_t *)local_a8);
    }
  }
  p_02 = Aig_ManStart(10000);
  pcVar8 = Abc_UtilStrsav(pAig->pName);
  p_02->pName = pcVar8;
  pcVar8 = Abc_UtilStrsav(pAig->pSpec);
  p_02->pSpec = pcVar8;
  for (iBit = 0; iVar2 = Saig_ManRegNum(pAig), iBit < iVar2; iBit = iBit + 1) {
    p = pAig->vCis;
    iVar2 = Saig_ManPiNum(pAig);
    pvVar9 = Vec_PtrEntry(p,iBit + iVar2);
    pAVar6 = Aig_ManConst1(p_02);
    iVar2 = Abc_InfoHasBit((uint *)(pCex + 1),iBit);
    pAVar6 = Aig_NotCond(pAVar6,(uint)((iVar2 != 0 ^ 0xffU) & 1));
    *(Aig_Obj_t **)((long)pvVar9 + 0x28) = pAVar6;
  }
  for (local_60 = 0; local_60 <= pCex->iFrame; local_60 = local_60 + 1) {
    pVVar5 = Vec_VecEntryInt(p_01,local_60);
    for (iBit = 0; iVar2 = Vec_IntSize(pVVar5), iBit < iVar2; iBit = iBit + 1) {
      iVar2 = Vec_IntEntry(pVVar5,iBit);
      pAVar6 = Aig_ManObj(pAig,iVar2);
      iVar2 = Aig_ObjIsNode(pAVar6);
      if (iVar2 == 0) {
        iVar2 = Aig_ObjIsCo(pAVar6);
        if (iVar2 == 0) {
          iVar2 = Aig_ObjIsConst1(pAVar6);
          if (iVar2 == 0) {
            iVar2 = Saig_ObjIsPi(pAig,pAVar6);
            if (iVar2 != 0) {
              iVar2 = Aig_ObjCioId(pAVar6);
              if (iVar2 < nInputs) {
                iVar2 = pCex->nRegs;
                iVar3 = pCex->nPis;
                iVar4 = Aig_ObjCioId(pAVar6);
                pAVar10 = Aig_ManConst1(p_02);
                iVar2 = Abc_InfoHasBit((uint *)(pCex + 1),iVar2 + local_60 * iVar3 + iVar4);
                pAVar10 = Aig_NotCond(pAVar10,(uint)((iVar2 != 0 ^ 0xffU) & 1));
                (pAVar6->field_5).pData = pAVar10;
              }
              else {
                pAVar10 = Aig_ObjCreateCi(p_02);
                (pAVar6->field_5).pData = pAVar10;
                pVVar7 = *pvMapPiF2A;
                iVar2 = Aig_ObjCioId(pAVar6);
                Vec_IntPush(pVVar7,iVar2);
                Vec_IntPush(*pvMapPiF2A,local_60);
              }
            }
          }
          else {
            pAVar10 = Aig_ManConst1(p_02);
            (pAVar6->field_5).pData = pAVar10;
          }
        }
        else {
          pAVar10 = Aig_ObjChild0Copy(pAVar6);
          (pAVar6->field_5).pData = pAVar10;
        }
      }
      else {
        pAVar10 = Aig_ObjChild0Copy(pAVar6);
        p1 = Aig_ObjChild1Copy(pAVar6);
        pAVar10 = Aig_And(p_02,pAVar10,p1);
        (pAVar6->field_5).pData = pAVar10;
      }
    }
    if (local_60 == pCex->iFrame) break;
    pVVar5 = Vec_VecEntryInt(p_00,local_60);
    for (iBit = 0; iVar2 = Vec_IntSize(pVVar5), iBit < iVar2; iBit = iBit + 1) {
      iVar2 = Vec_IntEntry(pVVar5,iBit);
      pAVar6 = Aig_ManObj(pAig,iVar2);
      aVar1 = pAVar6->field_5;
      pAVar6 = Saig_ObjLiToLo(pAig,pAVar6);
      pAVar6->field_5 = aVar1;
    }
  }
  pAVar6 = Aig_ManCo(pAig,pCex->iPo);
  pAVar6 = Aig_Not((Aig_Obj_t *)(pAVar6->field_5).pData);
  Aig_ObjCreateCo(p_02,pAVar6);
  Aig_ManSetRegNum(p_02,0);
  Vec_VecFree(p_00);
  Vec_VecFree(p_01);
  Aig_ManCleanup(p_02);
  return p_02;
}

Assistant:

Aig_Man_t * Saig_ManUnrollWithCex( Aig_Man_t * pAig, Abc_Cex_t * pCex, int nInputs, Vec_Int_t ** pvMapPiF2A )
{
    Aig_Man_t * pFrames;     // unrolled timeframes
    Vec_Vec_t * vFrameCos;   // the list of COs per frame
    Vec_Vec_t * vFrameObjs;  // the list of objects per frame
    Vec_Int_t * vRoots, * vObjs;
    Aig_Obj_t * pObj;
    int i, f;
    // sanity checks
    assert( Saig_ManPiNum(pAig) == pCex->nPis );
    assert( Saig_ManRegNum(pAig) == pCex->nRegs );
    assert( pCex->iPo >= 0 && pCex->iPo < Saig_ManPoNum(pAig) );

    // map PIs of the unrolled frames into PIs of the original design
    *pvMapPiF2A = Vec_IntAlloc( 1000 );

    // collect COs and Objs visited in each frame
    vFrameCos  = Vec_VecStart( pCex->iFrame+1 );
    vFrameObjs = Vec_VecStart( pCex->iFrame+1 );
    // initialized the topmost frame
    pObj = Aig_ManCo( pAig, pCex->iPo );
    Vec_VecPushInt( vFrameCos, pCex->iFrame, Aig_ObjId(pObj) );
    for ( f = pCex->iFrame; f >= 0; f-- )
    {
        // collect nodes starting from the roots
        Aig_ManIncrementTravId( pAig );
        vRoots = Vec_VecEntryInt( vFrameCos, f );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
            Saig_ManUnrollCollect_rec( pAig, pObj, 
                Vec_VecEntryInt(vFrameObjs, f),
                (Vec_Int_t *)(f ? Vec_VecEntry(vFrameCos, f-1) : NULL) );
    }

    // derive unrolled timeframes
    pFrames = Aig_ManStart( 10000 );
    pFrames->pName = Abc_UtilStrsav( pAig->pName );
    pFrames->pSpec = Abc_UtilStrsav( pAig->pSpec );
    // initialize the flops 
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->pData = Aig_NotCond( Aig_ManConst1(pFrames), !Abc_InfoHasBit(pCex->pData, i) );
    // iterate through the frames
    for ( f = 0; f <= pCex->iFrame; f++ )
    {
        // construct
        vObjs = Vec_VecEntryInt( vFrameObjs, f );
        Aig_ManForEachObjVec( vObjs, pAig, pObj, i )
        {
            if ( Aig_ObjIsNode(pObj) )
                pObj->pData = Aig_And( pFrames, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
            else if ( Aig_ObjIsCo(pObj) )
                pObj->pData = Aig_ObjChild0Copy(pObj);
            else if ( Aig_ObjIsConst1(pObj) )
                pObj->pData = Aig_ManConst1(pFrames);
            else if ( Saig_ObjIsPi(pAig, pObj) )
            {
                if ( Aig_ObjCioId(pObj) < nInputs )
                {
                    int iBit = pCex->nRegs + f * pCex->nPis + Aig_ObjCioId(pObj);
                    pObj->pData = Aig_NotCond( Aig_ManConst1(pFrames), !Abc_InfoHasBit(pCex->pData, iBit) );
                }
                else
                {
                    pObj->pData = Aig_ObjCreateCi( pFrames );
                    Vec_IntPush( *pvMapPiF2A, Aig_ObjCioId(pObj) );
                    Vec_IntPush( *pvMapPiF2A, f );
                }
            }
        }
        if ( f == pCex->iFrame )
            break;
        // transfer
        vRoots = Vec_VecEntryInt( vFrameCos, f );
        Aig_ManForEachObjVec( vRoots, pAig, pObj, i )
            Saig_ObjLiToLo( pAig, pObj )->pData = pObj->pData;
    }
    // create output
    pObj = Aig_ManCo( pAig, pCex->iPo );
    Aig_ObjCreateCo( pFrames, Aig_Not((Aig_Obj_t *)pObj->pData) );
    Aig_ManSetRegNum( pFrames, 0 );
    // cleanup
    Vec_VecFree( vFrameCos );
    Vec_VecFree( vFrameObjs );
    // finallize
    Aig_ManCleanup( pFrames );
    // return
    return pFrames;
}